

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

BOOL UTIL_IsExecuteBitsSet(stat *stat_data)

{
  __uid_t _Var1;
  __gid_t _Var2;
  __uid_t _Var3;
  uint uVar4;
  __gid_t _Var5;
  
  uVar4 = 0;
  if ((stat_data->st_mode & 0xf000) != 0x4000) {
    _Var1 = stat_data->st_uid;
    _Var3 = geteuid();
    if (_Var1 == _Var3) {
      uVar4 = stat_data->st_mode >> 6;
    }
    else {
      _Var2 = stat_data->st_gid;
      _Var5 = getegid();
      uVar4 = stat_data->st_mode;
      if (_Var2 == _Var5) {
        uVar4 = uVar4 >> 3;
      }
    }
    uVar4 = uVar4 & 1;
  }
  return uVar4;
}

Assistant:

BOOL UTIL_IsExecuteBitsSet( struct stat * stat_data )
{
    BOOL bRetVal = FALSE;

    if ( (stat_data->st_mode & S_IFMT) == S_IFDIR )
    {
        return FALSE;
    }
    
    /* Check for read permissions. */
    if ( stat_data->st_uid == geteuid() )
    {
        /* The process owner is the file owner as well. */
        if ( ( stat_data->st_mode & S_IXUSR ) )
        {
            bRetVal = TRUE;
        }
    }
    else if ( stat_data->st_gid == getegid() )
    {
        /* The process's owner is in the same group as the file's owner. */
        if ( ( stat_data->st_mode & S_IXGRP ) )
        {
            bRetVal = TRUE;
        }
    }
    else
    {
        /* Check the other bits to see who can access the file. */
        if ( ( stat_data->st_mode & S_IXOTH ) )
        {
            bRetVal = TRUE;
        }
    }

    return bRetVal;
}